

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O1

ostream * operator<<(ostream *out,ShapeConstraint *shape)

{
  pointer pcVar1;
  char cVar2;
  ostream *poVar3;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pcVar1 = (shape->_name)._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (shape->_name)._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_48,local_40);
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,":","");
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_68,local_60);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  operator<<(out,&shape->_sequenceRange);
  cVar2 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  operator<<(out,&shape->_batchRange);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  operator<<(out,&shape->_channelRange);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  operator<<(out,&shape->_heightRange);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  operator<<(out,&shape->_widthRange);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ShapeConstraint& shape) {
    out << shape.name() << std::string(":") << std::endl;
    out << shape.sequenceRange() << std::endl;
    out << shape.batchRange() << std::endl;
    out << shape.channelRange() << std::endl;
    out << shape.heightRange() << std::endl;
    out << shape.widthRange() << std::endl;
    return out;
}